

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon-util.c
# Opt level: O0

_Bool borg_excavate_vault(int range)

{
  short sVar1;
  short sVar2;
  chunk_conflict *c;
  _Bool _Var3;
  wchar_t wVar4;
  loc lVar5;
  loc_conflict grid;
  loc lVar6;
  borg_grid *ag;
  int b_x;
  int b_y;
  int ii;
  int i;
  int x;
  int y;
  int range_local;
  
  borg_temp_n = 0;
  if ((vault_on_level) &&
     ((_Var3 = borg_spell_okay_fail(TURN_STONE_TO_MUD,0x1e), _Var3 ||
      (_Var3 = borg_spell_okay_fail(SHATTER_STONE,0x1e), _Var3)))) {
    for (i = w_y; i < w_y + ((Term->hgt - row_top_map[Term->sidebar_mode]) -
                            row_bottom_map[Term->sidebar_mode]) / (int)(uint)tile_height; i = i + 1)
    {
      for (ii = w_x;
          ii < w_x + ((Term->wid - col_map[Term->sidebar_mode]) + -1) / (int)(uint)tile_width;
          ii = ii + 1) {
        lVar5 = loc(ii,i);
        lVar6.y = borg.c.y;
        lVar6.x = borg.c.x;
        wVar4 = distance(lVar6,lVar5);
        if ((wVar4 <= range) &&
           ((((borg_grids[i][ii].feat == '\x15' || (borg_grids[i][ii].feat == '\x10')) ||
             (borg_grids[i][ii].feat == '\x12')) ||
            (((borg_grids[i][ii].feat == '\x11' || (borg_grids[i][ii].feat == '\x14')) ||
             (borg_grids[i][ii].feat == '\x13')))))) {
          for (b_y = 0; c = cave, b_y < 8; b_y = b_y + 1) {
            sVar1 = ddx_ddd[b_y];
            sVar2 = ddy_ddd[b_y];
            grid = (loc_conflict)loc(ii + sVar1,i + sVar2);
            _Var3 = square_in_bounds_fully((chunk *)c,grid);
            if ((_Var3) && (borg_grids[i + sVar2][ii + sVar1].feat == '\x16')) {
              b_x = 0;
              while ((b_x < borg_temp_n &&
                     (((uint)borg_temp_y[b_x] != i || ((uint)borg_temp_x[b_x] != ii))))) {
                b_x = b_x + 1;
              }
              if ((b_x == borg_temp_n) && (b_x < 9000)) {
                borg_temp_x[b_x] = (uint8_t)ii;
                borg_temp_y[b_x] = (uint8_t)i;
                borg_temp_n = borg_temp_n + 1;
              }
            }
          }
        }
      }
    }
    if (borg_temp_n != 0) {
      for (b_y = 0; b_y < borg_temp_n; b_y = b_y + 1) {
        _Var3 = borg_los(borg.c.y,borg.c.x,(uint)borg_temp_y[b_y],(uint)borg_temp_x[b_y]);
        if (_Var3) {
          lVar6 = loc((uint)borg_temp_x[b_y],(uint)borg_temp_y[b_y]);
          borg_target(lVar6);
          _Var3 = borg_spell(TURN_STONE_TO_MUD);
          if (((_Var3) || (_Var3 = borg_activate_ring(sv_ring_digging), _Var3)) ||
             (_Var3 = borg_activate_item(act_stone_to_mud), _Var3)) {
LAB_002da035:
            borg_note("# Excavation of vault");
            borg_keypress(0x35);
            borg_do_update_view = true;
            borg_do_update_lite = true;
            borg_grids[borg_temp_y[b_y]][borg_temp_x[b_y]].info =
                 borg_grids[borg_temp_y[b_y]][borg_temp_x[b_y]].info & 0xfffd;
            borg_grids[borg_temp_y[b_y]][borg_temp_x[b_y]].info =
                 borg_grids[borg_temp_y[b_y]][borg_temp_x[b_y]].info | 2;
            borg_grids[borg_temp_y[b_y]][borg_temp_x[b_y]].feat = '\x01';
            borg_grids[borg_temp_y[b_y]][borg_temp_x[b_y]].info =
                 borg_grids[borg_temp_y[b_y]][borg_temp_x[b_y]].info | 0x100;
            track_vein.num = 0;
            return true;
          }
          lVar6 = loc((uint)borg_temp_x[b_y],(uint)borg_temp_y[b_y]);
          lVar5.y = borg.c.y;
          lVar5.x = borg.c.x;
          wVar4 = distance(lVar5,lVar6);
          if ((wVar4 == L'\x01') && (_Var3 = borg_spell(SHATTER_STONE), _Var3)) goto LAB_002da035;
        }
      }
    }
  }
  return false;
}

Assistant:

bool borg_excavate_vault(int range)
{
    int y, x, i, ii;
    int b_y, b_x;

    borg_grid *ag;

    /* reset counters */
    borg_temp_n = 0;
    i           = 0;
    ii          = 0;

    /* no need if no vault on level */
    if (!vault_on_level)
        return false;

    /* only if you can cast the spell */
    if (!borg_spell_okay_fail(TURN_STONE_TO_MUD, 30)
        && !borg_spell_okay_fail(SHATTER_STONE, 30))
        return false;

    /* Danger/bad idea checks */

    /* build the array -- Scan screen */
    for (y = w_y; y < w_y + SCREEN_HGT; y++) {
        for (x = w_x; x < w_x + SCREEN_WID; x++) {

            /* only bother with near ones */
            if (distance(borg.c, loc(x, y)) > range)
                continue;

            /* only deal with excavatable walls */
            if (borg_grids[y][x].feat != FEAT_GRANITE
                && borg_grids[y][x].feat != FEAT_RUBBLE
                && borg_grids[y][x].feat != FEAT_QUARTZ
                && borg_grids[y][x].feat != FEAT_MAGMA
                && borg_grids[y][x].feat != FEAT_QUARTZ_K
                && borg_grids[y][x].feat != FEAT_MAGMA_K)
                continue;

            /* Examine grids adjacent to this grid to see if there is a perma
             * wall adjacent */
            for (i = 0; i < 8; i++) {
                b_x = x + ddx_ddd[i];
                b_y = y + ddy_ddd[i];

                /* Bounds check */
                if (!square_in_bounds_fully(cave, loc(b_x, b_y)))
                    continue;

                ag = &borg_grids[b_y][b_x];

                /* Not a perma, and not our spot. */
                if (ag->feat != FEAT_PERM)
                    continue;

                /* Track the new grid */
                for (ii = 0; ii < borg_temp_n; ii++) {
                    if (borg_temp_y[ii] == y && borg_temp_x[ii] == x)
                        break;
                }

                /* Track the newly discovered excavatable wall */
                if ((ii == borg_temp_n) && (ii < AUTO_TEMP_MAX)) {
                    borg_temp_x[ii] = x;
                    borg_temp_y[ii] = y;
                    borg_temp_n++;
                }
            }
        }
    }

    /* None to excavate */
    if (!borg_temp_n)
        return false;

    /* Review the useful grids */
    for (i = 0; i < borg_temp_n; i++) {
        /* skip non-projectable grids grid (I cant shoot them) */
        if (!borg_los(borg.c.y, borg.c.x, borg_temp_y[i], borg_temp_x[i]))
            continue;

        /* Attempt to target the grid */
        borg_target(loc(borg_temp_x[i], borg_temp_y[i]));

        /* Attempt to excavate it with "stone to mud" */
        if (borg_spell(TURN_STONE_TO_MUD) 
            || borg_activate_ring(sv_ring_digging)
            || borg_activate_item(act_stone_to_mud)
            || (distance(borg.c, loc(borg_temp_x[i], borg_temp_y[i])) == 1 
                && borg_spell(SHATTER_STONE))
            ) {
            borg_note("# Excavation of vault");
            borg_keypress('5');

            /* turn that wall into a floor grid.  If the spell failed and the
             * grid is visible, it will still look like a wall and the
             * borg_update routine will redefine it as a wall
             */
            borg_do_update_view = true;
            borg_do_update_lite = true;

            /* Not Lit */
            borg_grids[borg_temp_y[i]][borg_temp_x[i]].info &= ~BORG_GLOW;
            /* Dark */
            borg_grids[borg_temp_y[i]][borg_temp_x[i]].info |= BORG_GLOW;
            /* Feat Floor */
            borg_grids[borg_temp_y[i]][borg_temp_x[i]].feat = FEAT_FLOOR;
            /*
             * If the grid is not seen, prefer what the borg remembers over
             * what map_info() returns (i.e. optimistically assume that the
             * excavation was successful.
             */
            borg_grids[borg_temp_y[i]][borg_temp_x[i]].info |= BORG_IGNORE_MAP;
            /* Forget number of mineral veins to force rebuild of vein list */
            track_vein.num = 0;

            return true;
        }
    }

    /* No grid to excavate */
    return false;
}